

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_EdgeWait_TestShell::~TEST_MinipointCounterTest_EdgeWait_TestShell
          (TEST_MinipointCounterTest_EdgeWait_TestShell *this)

{
  TEST_MinipointCounterTest_EdgeWait_TestShell *mem;
  TEST_MinipointCounterTest_EdgeWait_TestShell *this_local;
  
  mem = this;
  ~TEST_MinipointCounterTest_EdgeWait_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(MinipointCounterTest, EdgeWait)
{
	addOpenNoPointHand();

	h.last_tile = Tile::ThreeOfCharacters;
	s.winByDiscard();
	CHECK_EQUAL(22, m.total(false));

	h.last_tile = Tile::SevenOfCharacters;
	s.winByDiscard();
	CHECK_EQUAL(22, m.total(false));
}